

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

shared_ptr<duckdb::BaseFileReader,_true> __thiscall
duckdb::ParquetMultiFileInfo::CreateReader
          (ParquetMultiFileInfo *this,ClientContext *context,GlobalTableFunctionState *param_2,
          OpenFileInfo *file,idx_t file_idx,MultiFileBindData *multi_bind_data)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::BaseFileReader,_true> sVar2;
  element_type *local_28;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>::
  operator->(&multi_bind_data->bind_data);
  make_shared_ptr<duckdb::ParquetReader,duckdb::ClientContext&,duckdb::OpenFileInfo_const&,duckdb::ParquetOptions&>
            ((ClientContext *)&stack0xffffffffffffffd8,(OpenFileInfo *)context,
             (ParquetOptions *)file);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  local_28 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  sVar2.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BaseFileReader,_true>)
         sVar2.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BaseFileReader> ParquetMultiFileInfo::CreateReader(ClientContext &context, GlobalTableFunctionState &,
                                                              const OpenFileInfo &file, idx_t file_idx,
                                                              const MultiFileBindData &multi_bind_data) {
	auto &bind_data = multi_bind_data.bind_data->Cast<ParquetReadBindData>();
	return make_shared_ptr<ParquetReader>(context, file, bind_data.parquet_options);
}